

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O3

void __thiscall mocker::detail::RegisterAllocator::allocate(RegisterAllocator *this)

{
  InterferenceGraph *this_00;
  element_type *peVar1;
  Node *pNVar2;
  pointer psVar3;
  bool bVar4;
  ostream *poVar5;
  shared_ptr<mocker::nasm::Register> *reg;
  pointer psVar6;
  shared_ptr<mocker::nasm::Register> *node;
  Node *n;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  toBeSpilled;
  RegMap<Node> coloring;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  nonPrecolored;
  undefined1 local_18a;
  undefined1 local_189;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_188;
  _Any_data local_170;
  code *local_160;
  code *pcStack_158;
  undefined4 local_150;
  undefined8 local_148;
  __node_base_ptr p_Stack_140;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_138;
  MoveInfo *local_130;
  function<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&)>
  *local_128;
  function<bool_(const_std::shared_ptr<mocker::nasm::Register>_&)> *local_120;
  pointer local_118;
  pointer local_110;
  _Any_data *local_108;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_98;
  _Any_data local_80;
  code *local_70;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  this_00 = &this->interG;
  local_120 = &(this->interG).isMoveRelated;
  local_128 = &(this->interG).freezeMoves;
  local_130 = &this->moveInfo;
  local_138 = &(this->spilledLastTime)._M_h;
  do {
    getNonPrecoloredNodes(&local_98,(this->funcBeg)._M_node,(this->funcEnd)._M_node);
    InterferenceGraph::clearAndInit(this_00,&local_98);
    local_b8._8_8_ = 0;
    local_a0 = std::
               _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:467:22)>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:467:22)>
               ::_M_manager;
    local_d8._8_8_ = 0;
    local_c0 = std::
               _Function_handler<bool_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:472:24)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<bool_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:472:24)>
               ::_M_manager;
    local_f8._8_8_ = 0;
    local_e0 = std::
               _Function_handler<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:475:22)>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:475:22)>
               ::_M_manager;
    local_f8._M_unused._M_object = this;
    local_d8._M_unused._M_object = this;
    local_b8._M_unused._M_object = this;
    std::function<void_(const_std::shared_ptr<mocker::nasm::Register>_&)>::operator=
              (&this_00->enableMoves,
               (function<void_(const_std::shared_ptr<mocker::nasm::Register>_&)> *)&local_b8);
    std::function<bool_(const_std::shared_ptr<mocker::nasm::Register>_&)>::operator=
              (local_120,
               (function<bool_(const_std::shared_ptr<mocker::nasm::Register>_&)> *)&local_d8);
    std::
    function<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&)>
    ::operator=(local_128,
                (function<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&)>
                 *)&local_f8);
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    MoveInfo::clearAndInit(local_130,&local_98);
    local_80._8_8_ = 0;
    local_68._M_buckets =
         (__buckets_ptr)
         std::
         _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Mov>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:485:9)>
         ::_M_invoke;
    local_70 = std::
               _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Mov>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:485:9)>
               ::_M_manager;
    local_170._8_8_ = 0;
    pcStack_158 = std::
                  _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Mov>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:486:9)>
                  ::_M_invoke;
    local_160 = std::
                _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Mov>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:486:9)>
                ::_M_manager;
    local_170._M_unused._M_object = this;
    local_80._M_unused._M_object = this;
    InterferenceGraph::build
              (this_00,(this->funcBeg)._M_node,(this->funcEnd)._M_node,
               (function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *)&local_80,
               (function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *)&local_170);
    if (local_160 != (code *)0x0) {
      (*local_160)(&local_170,&local_170,3);
    }
    n = local_98.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    pNVar2 = local_98.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_70 != (code *)0x0) {
      (*local_70)(&local_80,&local_80,3);
      n = local_98.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      pNVar2 = local_98.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; n != pNVar2; n = n + 1) {
      InterferenceGraph::classifyNode(this_00,n);
    }
    do {
      do {
        bVar4 = InterferenceGraph::simplify(this_00);
      } while (bVar4);
      bVar4 = coalesce(this);
    } while (((bVar4) || (bVar4 = InterferenceGraph::freezeNode(this_00), bVar4)) ||
            (bVar4 = InterferenceGraph::spill(this_00), bVar4));
    local_188.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_170._M_unused._M_object = &p_Stack_140;
    local_170._8_8_ = 1;
    local_160 = (code *)0x0;
    pcStack_158 = (code *)0x0;
    local_150 = 0x3f800000;
    local_148 = 0;
    p_Stack_140 = (__node_base_ptr)0x0;
    InterferenceGraph::assignColors
              ((pair<std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>_>
                *)&local_80,this_00);
    local_108 = &local_170;
    local_100 = &local_188;
    std::
    tuple<std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>&,std::unordered_map<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>const,std::shared_ptr<mocker::nasm::Register>>>>&>
    ::operator=((tuple<std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>&,std::unordered_map<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>const,std::shared_ptr<mocker::nasm::Register>>>>&>
                 *)&local_108,
                (pair<std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>_>
                 *)&local_80);
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               *)&local_80);
    local_110 = local_188.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_118 = local_188.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_188.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_188.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      color(this,(RegMap<Node> *)&local_170);
    }
    else {
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
                ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_80,
                 local_188.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_188.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0,&local_108,&local_189,&local_18a);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_move_assign(local_138,&local_80);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_80);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\nto be spilled: ",0x10);
      psVar3 = local_188.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar6 = local_188.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1
          ) {
        peVar1 = (psVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(peVar1->identifier)._M_dataplus._M_p,
                            (peVar1->identifier)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      rewriteProgram(this,&local_188);
    }
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_170);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~vector(&local_188);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~vector(&local_98);
  } while (local_110 != local_118);
  return;
}

Assistant:

void RegisterAllocator::allocate() {
  auto enableMoves = [this](const Node &n) {
    auto movs = moveInfo.getCurAssociatedMoves(n);
    for (auto &mov : movs)
      moveInfo.enableMove(mov);
  };
  auto isMoveRelated = [this](const Node &n) {
    return moveInfo.isMoveRelated(n);
  };
  auto freezeMoves = [this](const Node &n) { return moveInfo.freezeMoves(n); };

  while (true) {
    auto nonPrecolored = getNonPrecoloredNodes(funcBeg, funcEnd);
    interG.clearAndInit(nonPrecolored);
    interG.bindFunctions(enableMoves, isMoveRelated, freezeMoves);
    moveInfo.clearAndInit(nonPrecolored);

    interG.build(
        funcBeg, funcEnd,
        [this](const MovInst &mov) { moveInfo.pushWorklist(mov); },
        [this](const MovInst &mov) { moveInfo.updateAssociatedMoves(mov); });
    interG.initWorklists(nonPrecolored);

    while (true) {
      if (interG.simplify())
        continue;
      if (coalesce())
        continue;
      if (interG.freezeNode())
        continue;
      if (interG.spill())
        continue;
      break;
    }

    std::vector<Node> toBeSpilled;
    RegMap<Node> coloring;
    std::tie(toBeSpilled, coloring) = interG.assignColors();
    if (toBeSpilled.empty()) {
      color(coloring);
      break;
    }
    spilledLastTime = RegSet(toBeSpilled.begin(), toBeSpilled.end());
    std::cerr << "\nto be spilled: ";
    for (auto &reg : toBeSpilled)
      std::cerr << reg->getIdentifier() << ", ";
    std::cerr << std::endl;
    rewriteProgram(toBeSpilled);
  }
}